

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asa152.cpp
# Opt level: O0

double chyper(bool point,int kk,int ll,int mm,int nn,int *ifault)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  double dVar6;
  double dVar7;
  __type _Var8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double local_b0;
  double value;
  double sig;
  double scale;
  double rootpi;
  double pt;
  double p;
  int nl;
  int n;
  int mvbig;
  int mnkl;
  double mean;
  int mbig;
  int m;
  int l;
  int kl;
  int k;
  int j;
  int i;
  double elimit;
  bool dir;
  double arg;
  int *ifault_local;
  int nn_local;
  int mm_local;
  int ll_local;
  int kk_local;
  bool point_local;
  
  *ifault = 0;
  l = kk + 1;
  mbig = ll + 1;
  iVar2 = mm + 1;
  iVar3 = nn + 1;
  local_b0 = 0.0;
  if ((((iVar3 < 1) || (iVar2 < iVar3)) || (l < 1)) || (iVar2 < l)) {
    *ifault = 1;
    _kk_local = 0.0;
  }
  else if ((mbig < 1) || (iVar2 - iVar3 < l - mbig)) {
    *ifault = 2;
    _kk_local = 0.0;
  }
  else {
    if (!point) {
      local_b0 = 1.0;
    }
    if ((iVar3 < mbig) || (l < mbig)) {
      *ifault = 2;
      _kk_local = local_b0;
    }
    else {
      *ifault = 0;
      local_b0 = 1.0;
      if ((((l == 1) || (l == iVar2)) || (iVar3 == 1)) || (iVar3 == iVar2)) {
        _kk_local = 1.0;
      }
      else if ((point) || (iVar4 = i4_min(kk,nn), ll != iVar4)) {
        pt = (double)nn / (double)(mm - nn);
        dVar6 = r8_max(pt,1.0 / pt);
        iVar4 = i4_min(kk,mm - kk);
        if (((double)iVar4 <= dVar6 * 16.0) || (mm < 0x3e9)) {
          iVar4 = i4_min(nn,iVar2 - iVar3);
          iVar5 = i4_min(kk,iVar2 - l);
          p._4_4_ = iVar3;
          if (iVar4 < iVar5) {
            p._4_4_ = l;
            l = iVar3;
          }
          bVar1 = iVar2 - l < l + -1;
          if (bVar1) {
            mbig = (p._4_4_ - mbig) + 1;
            l = (iVar2 - l) + 1;
          }
          bVar1 = !bVar1;
          if (mm < 0x259) {
            for (k = 1; k <= mbig + -1; k = k + 1) {
              local_b0 = (local_b0 * (double)((l - k) * (p._4_4_ - k))) /
                         (double)((mbig - k) * (iVar2 - k));
            }
            if (mbig != l) {
              for (k = mbig; k <= l + -1; k = k + 1) {
                local_b0 = (local_b0 * (double)(((iVar2 - p._4_4_) + mbig) - k)) /
                           (double)(iVar2 - k);
              }
            }
          }
          else {
            dVar6 = alnfac(nn);
            dVar7 = alnfac(mm);
            dVar9 = alnfac(mm - kk);
            dVar10 = alnfac(kk);
            dVar11 = alnfac(mm - nn);
            dVar12 = alnfac(ll);
            dVar13 = alnfac(nn - ll);
            dVar14 = alnfac(kk - ll);
            dVar15 = alnfac(((mm - nn) - kk) + ll);
            pt = (((((dVar6 - dVar7) + dVar9 + dVar10 + dVar11) - dVar12) - dVar13) - dVar14) -
                 dVar15;
            if (pt < -88.0) {
              local_b0 = 0.0;
            }
            else {
              local_b0 = exp(pt);
            }
          }
          if (point) {
            return local_b0;
          }
          if ((local_b0 != 0.0) || (NAN(local_b0))) {
            pt = local_b0 * 1e+35;
          }
          else {
            if (mm < 0x259) {
              dVar6 = alnfac(nn);
              dVar7 = alnfac(mm);
              dVar9 = alnfac(kk);
              dVar10 = alnfac(mm - nn);
              dVar11 = alnfac(ll);
              dVar12 = alnfac(nn - ll);
              dVar13 = alnfac(kk - ll);
              dVar14 = alnfac(((mm - nn) - kk) + ll);
              dVar15 = alnfac(mm - kk);
              pt = ((((((dVar6 - dVar7) + dVar9 + dVar10) - dVar11) - dVar12) - dVar13) - dVar14) +
                   dVar15;
            }
            dVar6 = log(1e+35);
            if (pt + dVar6 < -88.0) {
              *ifault = 3;
              if ((double)(nn * kk + nn + kk + 1) / (double)(mm + 2) < (double)ll) {
                local_b0 = 1.0;
              }
              return local_b0;
            }
            pt = exp(pt + dVar6);
          }
          rootpi = 0.0;
          iVar3 = l - mbig;
          iVar2 = ((iVar2 - p._4_4_) - iVar3) + 1;
          if (iVar3 < mbig) {
            bVar1 = !bVar1;
            for (kl = 0; kl <= iVar3 + -1; kl = kl + 1) {
              pt = (pt * (double)(((p._4_4_ - mbig) - kl) * (iVar3 - kl))) /
                   (double)((mbig + kl) * (iVar2 + kl));
              rootpi = rootpi + pt;
            }
          }
          else {
            for (k = 1; k <= mbig + -1; k = k + 1) {
              pt = (pt * (double)((mbig - k) * (iVar2 - k))) /
                   (double)(((p._4_4_ - mbig) + k) * (iVar3 + k));
              rootpi = rootpi + pt;
            }
          }
          if ((pt == 0.0) && (!NAN(pt))) {
            *ifault = 3;
          }
          if (bVar1) {
            local_b0 = local_b0 + rootpi / 1e+35;
          }
          else {
            local_b0 = 1.0 - rootpi / 1e+35;
          }
        }
        else {
          dVar6 = (double)(kk * nn) / (double)mm;
          dVar7 = sqrt(dVar6 * ((double)(mm - nn) / (double)mm) *
                       ((double)(mm - kk) / (double)(mm + -1)));
          if (point) {
            _Var8 = std::pow<double,int>(((double)ll - dVar6) / dVar7,2);
            if (_Var8 * -0.5 < -88.0) {
              local_b0 = 0.0;
            }
            else {
              local_b0 = exp(_Var8 * -0.5);
              local_b0 = local_b0 / (dVar7 * 2.506628274631001);
            }
          }
          else {
            local_b0 = alnorm((((double)ll + 0.5) - dVar6) / dVar7,false);
          }
        }
        _kk_local = local_b0;
      }
      else {
        _kk_local = 1.0;
      }
    }
  }
  return _kk_local;
}

Assistant:

double chyper ( bool point, int kk, int ll, int mm, int nn, int *ifault )

//****************************************************************************80
//
//  Purpose:
//
//    CHYPER computes point or cumulative hypergeometric probabilities.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    27 January 2008
//
//  Author:
//
//    Original FORTRAN77 version by Richard Lund.
//    C++ version by John Burkardt.
//
//  Reference:
//
//    PR Freeman,
//    Algorithm AS 59:
//    Hypergeometric Probabilities,
//    Applied Statistics,
//    Volume 22, Number 1, 1973, pages 130-133.
//
//    Richard Lund,
//    Algorithm AS 152:
//    Cumulative hypergeometric probabilities,
//    Applied Statistics,
//    Volume 29, Number 2, 1980, pages 221-223.
//
//    BL Shea,
//    Remark AS R77:
//    A Remark on Algorithm AS 152: Cumulative hypergeometric probabilities,
//    Applied Statistics,
//    Volume 38, Number 1, 1989, pages 199-204.
//
//  Parameters:
//
//    Input, bool POINT, is TRUE if the point probability is desired,
//    and FALSE if the cumulative probability is desired.
//
//    Input, int KK, the sample size.
//    0 <= KK <= MM.
//
//    Input, int LL, the number of successes in the sample.
//    0 <= LL <= KK.
//
//    Input, int MM, the population size that was sampled.
//    0 <= MM.
//
//    Input, int NN, the number of "successes" in the population.
//    0 <= NN <= MM.
//
//    Output, int *IFAULT, error flag.
//    0, no error occurred.
//    nonzero, an error occurred.
//
//    Output, double CHYPER, the PDF (point probability) of
//    exactly LL successes out of KK samples, or the CDF (cumulative
//    probability) of up to LL successes out of KK samples.
//
{
  double arg;
  bool dir;
  double elimit = - 88.0;
  int i;
  int j;
  int k;
  int kl;
  int l;
  int m;
  int mbig = 600;
  double mean;
  int mnkl;
  int mvbig = 1000;
  int n;
  int nl;
  double p;
  double pt;
  double rootpi = 2.506628274631001;
  double scale = 1.0E+35;
  double sig;
  double value;

  *ifault = 0;

  k = kk + 1;
  l = ll + 1;
  m = mm + 1;
  n = nn + 1;

  dir = true;
//
//  Check arguments are within permitted limits.
//
  value = 0.0;

  if ( n < 1 || m < n || k < 1 || m < k )
  {
    *ifault = 1;
    return value;
  }

  if ( l < 1 || m - n < k - l )
  {
    *ifault = 2;
    return value;
  }

  if ( !point )
  {
    value = 1.0;
  }

  if ( n < l || k < l )
  {
    *ifault = 2;
    return value;
  }

  *ifault = 0;
  value = 1.0;

  if ( k == 1 || k == m || n == 1 || n == m )
  {
    return value;
  }

  if ( !point && ll == i4_min ( kk, nn ) )
  {
    return value;
  }

  p = static_cast<double> ( nn ) / static_cast<double> ( mm - nn );

  if ( 16.0 * r8_max ( p, 1.0 / p ) 
    < static_cast<double> ( i4_min ( kk, mm - kk ) ) &&
    mvbig < mm && - 100.0 < elimit )
  {
//
//  Use a normal approximation.
//
    mean = static_cast<double> ( kk * nn ) / static_cast<double> ( mm );

    sig = sqrt ( mean * ( static_cast<double> ( mm - nn ) / static_cast<double> ( mm ) ) 
    * ( static_cast<double> ( mm - kk ) / ( static_cast<double> ( mm - 1 ) ) ) );

    if ( point )
    {
      arg = - 0.5 * ( pow ( ( static_cast<double> ( ll ) - mean ) / sig, 2 ) );
      if ( elimit <= arg )
      {
        value = exp ( arg ) / ( sig * rootpi );
      }
      else
      {
        value = 0.0;
      }
    }
    else
    {
      value = alnorm ( ( static_cast<double> ( ll ) + 0.5 - mean ) / sig, false );
    }
  }
  else
  {
//
//  Calculate exact hypergeometric probabilities.
//  Interchange K and N if this saves calculations.
//
    if ( i4_min ( n - 1, m - n ) < i4_min ( k - 1, m - k ) )
    {
      i = k;
      k = n;
      n = i;
    }

    if ( m - k < k - 1 )
    {
      dir = !dir;
      l = n - l + 1;
      k = m - k + 1;
    }

    if ( mbig < mm )
    {
//
//  Take logarithms of factorials.
//
      p = alnfac ( nn ) 
        - alnfac ( mm ) 
        + alnfac ( mm - kk ) 
        + alnfac ( kk ) 
        + alnfac ( mm - nn ) 
        - alnfac ( ll ) 
        - alnfac ( nn - ll ) 
        - alnfac ( kk - ll ) 
        - alnfac ( mm - nn - kk + ll );

      if ( elimit <= p )
      {
        value = exp ( p );
      }
      else
      {
        value = 0.0;
      }
    }
    else
    {
//
//  Use Freeman/Lund algorithm.
//
      for ( i = 1; i <= l - 1; i++ )
      {
        value = value * static_cast<double> ( ( k - i ) * ( n - i ) ) 
        / static_cast<double> ( ( l - i ) * ( m - i ) );
      }

      if ( l != k )
      {
        j = m - n + l;
        for ( i = l; i <= k - 1; i++ )
        {
          value = value * static_cast<double> ( j - i ) / static_cast<double> ( m - i );
        }
      }
    }

    if ( point )
    {
      return value;
    }

    if ( value == 0.0 )
    {
//
//  We must recompute the point probability since it has underflowed.
//
      if ( mm <= mbig )
      {
        p = alnfac ( nn ) 
          - alnfac ( mm ) 
          + alnfac ( kk ) 
          + alnfac ( mm - nn ) 
          - alnfac ( ll ) 
          - alnfac ( nn - ll ) 
          - alnfac ( kk - ll ) 
          - alnfac ( mm - nn - kk + ll ) 
          + alnfac ( mm - kk );
      }

      p = p + log ( scale );

      if ( p < elimit )
      {
        *ifault = 3;
        if ( static_cast<double> ( nn * kk + nn + kk + 1 ) 
          / static_cast<double> ( mm + 2 ) < static_cast<double> ( ll ) )
        {
          value = 1.0;
        }
        return value;
      }
      else
      {
        p = exp ( p );
      }
    }
    else
//
//  Scale up at this point.
//
    {
      p = value * scale;
    }

    pt = 0.0;
    nl = n - l;
    kl = k - l;
    mnkl = m - n - kl + 1;

    if ( l <= kl )
    {
      for ( i = 1; i <= l - 1; i++ )
      {
        p = p * static_cast<double> ( ( l - i ) * ( mnkl - i ) ) / 
        static_cast<double> ( ( nl + i ) * ( kl + i ) );
        pt = pt + p;
      }
    }
    else
    {
      dir = !dir;
      for ( j = 0; j <= kl - 1; j++ )
      {
        p = p * static_cast<double> ( ( nl - j ) * ( kl - j ) ) 
        / static_cast<double> ( ( l + j ) * ( mnkl + j ) );
        pt = pt + p;
      }
    }

    if ( p == 0.0 )
    {
      *ifault = 3;
    }

    if ( dir )
    {
      value = value + ( pt / scale );
    }
    else
    {
      value = 1.0 - ( pt / scale );
    }
  }

  return value;
}